

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-backend-ops.cpp
# Opt level: O2

bool __thiscall
test_case::eval(test_case *this,ggml_backend_t backend1,ggml_backend_t backend2,char *op_name)

{
  pointer ppgVar1;
  bool bVar2;
  char cVar3;
  byte bVar4;
  int iVar5;
  ggml_context *ctx;
  ggml_cgraph *pgVar6;
  undefined4 extraout_var;
  long lVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  char *__s;
  long lVar10;
  pointer ppgVar11;
  callback_userdata ud;
  undefined8 local_50 [4];
  
  this->mode = MODE_TEST;
  ggml_tensor_overhead();
  ggml_graph_overhead();
  ctx = (ggml_context *)ggml_init();
  if (ctx == (ggml_context *)0x0) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/tests/test-backend-ops.cpp"
               ,0x1bc,"GGML_ASSERT(%s) failed","ctx");
  }
  pgVar6 = (ggml_cgraph *)ggml_new_graph(ctx);
  this->gf = pgVar6;
  add_sentinel(this,ctx);
  iVar5 = (*this->_vptr_test_case[4])(this,ctx);
  uVar9 = CONCAT44(extraout_var,iVar5);
  if (op_name != (char *)0x0) {
    (*this->_vptr_test_case[2])(&ud,this,uVar9);
    bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ud
                            ,op_name);
    std::__cxx11::string::~string((string *)&ud);
    if (bVar2) goto LAB_00131574;
  }
  (*this->_vptr_test_case[2])(&ud,this,uVar9);
  (*this->_vptr_test_case[3])(local_50,this);
  printf("  %s(%s): ",ud._0_8_,local_50[0]);
  std::__cxx11::string::~string((string *)local_50);
  std::__cxx11::string::~string((string *)&ud);
  fflush(_stdout);
  ud._0_8_ = backend1;
  ud.max_err = (double)backend2;
  bVar2 = true;
  for (lVar10 = 0; lVar10 != 0x10; lVar10 = lVar10 + 8) {
    uVar8 = *(undefined8 *)(&ud.ok + lVar10);
    for (lVar7 = ggml_get_first_tensor(ctx); lVar7 != 0; lVar7 = ggml_get_next_tensor(ctx,lVar7)) {
      cVar3 = ggml_backend_supports_op(uVar8,lVar7);
      if (cVar3 == '\0') {
        uVar8 = ggml_backend_name(uVar8);
        bVar2 = false;
        printf("not supported [%s] ",uVar8);
        break;
      }
    }
  }
  if (bVar2) {
    add_sentinel(this,ctx);
    lVar10 = ggml_backend_alloc_ctx_tensors(ctx,backend1);
    if (lVar10 != 0) {
      ggml_build_forward_expand(this->gf,uVar9);
      ppgVar1 = (this->sentinels).super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      for (ppgVar11 = (this->sentinels).
                      super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>._M_impl.
                      super__Vector_impl_data._M_start; ppgVar11 != ppgVar1; ppgVar11 = ppgVar11 + 1
          ) {
        ggml_graph_add_node(this->gf,*ppgVar11);
      }
      (*this->_vptr_test_case[0xb])(this,ctx);
      ud.ok = true;
      (*this->_vptr_test_case[5])(this);
      ud.backend1 = backend1;
      ud.backend2 = backend2;
      bVar4 = ggml_backend_compare_graph_backend
                        (backend1,backend2,this->gf,eval::anon_class_1_0_00000001::__invoke,&ud);
      if (bVar4 == 0) {
        printf("compare failed ");
      }
      ggml_backend_buffer_free(lVar10);
      ggml_free(ctx);
      bVar4 = ud.ok & bVar4;
      __s = "\x1b[1;31mFAIL\x1b[0m";
      if (bVar4 != 0) {
        __s = "\x1b[1;32mOK\x1b[0m";
      }
      puts(__s);
      return (bool)bVar4;
    }
    uVar9 = ggml_backend_name(backend1);
    printf("failed to allocate tensors [%s] ",uVar9);
    ggml_free(ctx);
    return false;
  }
  putchar(10);
LAB_00131574:
  ggml_free(ctx);
  return true;
}

Assistant:

bool eval(ggml_backend_t backend1, ggml_backend_t backend2, const char * op_name) {
        mode = MODE_TEST;

        ggml_init_params params = {
            /* .mem_size = */ ggml_tensor_overhead()*128 + ggml_graph_overhead(),
            /* .mem_base = */ NULL,
            /* .no_alloc = */ true,
        };
        ggml_context * ctx = ggml_init(params);
        GGML_ASSERT(ctx);

        gf = ggml_new_graph(ctx);

        // pre-graph sentinel
        add_sentinel(ctx);

        ggml_tensor * out = build_graph(ctx);

        if (op_name != nullptr && op_desc(out) != op_name) {
            //printf("  %s: skipping\n", op_desc(out).c_str());
            ggml_free(ctx);
            return true;
        }

        printf("  %s(%s): ", op_desc(out).c_str(), vars().c_str());
        fflush(stdout);

        // check if the backends support the ops
        bool supported = true;
        for (ggml_backend_t backend : {backend1, backend2}) {
            for (ggml_tensor * t = ggml_get_first_tensor(ctx); t != NULL; t = ggml_get_next_tensor(ctx, t)) {
                if (!ggml_backend_supports_op(backend, t)) {
                    printf("not supported [%s] ", ggml_backend_name(backend));
                    supported = false;
                    break;
                }
            }
        }
        if (!supported) {
            printf("\n");
            ggml_free(ctx);
            return true;
        }

        // post-graph sentinel
        add_sentinel(ctx);

        // allocate
        ggml_backend_buffer_t buf = ggml_backend_alloc_ctx_tensors(ctx, backend1);

        if (buf == NULL) {
            printf("failed to allocate tensors [%s] ", ggml_backend_name(backend1));
            ggml_free(ctx);
            return false;
        }

        // build graph
        ggml_build_forward_expand(gf, out);

        // add sentinels as graph nodes so that they are checked in the callback
        for (ggml_tensor * sentinel : sentinels) {
            ggml_graph_add_node(gf, sentinel);
        }

        // randomize tensors
        initialize_tensors(ctx);

        // compare
        struct callback_userdata {
            bool   ok;
            double max_err;
            ggml_backend_t backend1;
            ggml_backend_t backend2;
        };

        callback_userdata ud {
            true,
            max_nmse_err(),
            backend1,
            backend2
        };

        auto callback = [](int index, ggml_tensor * t1, ggml_tensor * t2, void * user_data) -> bool {
            callback_userdata * ud = (callback_userdata *) user_data;
            const char * bn1 = ggml_backend_name(ud->backend1);
            const char * bn2 = ggml_backend_name(ud->backend2);

            if (t1->op == GGML_OP_NONE) {
                // sentinels must be unchanged
                std::vector<uint8_t> t1_data(ggml_nbytes(t1));
                std::vector<uint8_t> t2_data(ggml_nbytes(t2));
                ggml_backend_tensor_get(t1, t1_data.data(), 0, ggml_nbytes(t1));
                ggml_backend_tensor_get(t2, t2_data.data(), 0, ggml_nbytes(t2));

                if (memcmp(t1_data.data(), t2_data.data(), ggml_nbytes(t1)) != 0) {
                    printf("sentinel mismatch: %s ", t1->name);
                    ud->ok = false;
                    return true;
                }
            }

            std::vector<float> f1 = tensor_to_float(t1);
            std::vector<float> f2 = tensor_to_float(t2);

            for (size_t i = 0; i < f1.size(); i++) {
                // check for nans
                if (std::isnan(f1[i]) || std::isnan(f2[i])) {
                    printf("[%s] NaN at index %zu (%s=%f %s=%f) ", ggml_op_desc(t1), i, bn1, f1[i], bn2, f2[i]);
                    ud->ok = false;
                    return true;
                }
                // check for infs: both must be inf of the same sign, or both must be finite
                if (isinf_or_max(f1[i]) || isinf_or_max(f2[i])) {
                    if (isinf_or_max(f1[i]) && isinf_or_max(f2[i])) {
                        if (std::signbit(f1[i]) != std::signbit(f2[i])) {
                            printf("[%s] inf sign mismatch: %s=%f %s=%f ", ggml_op_desc(t1), bn1, f1[i], bn2, f2[i]);
                            ud->ok = false;
                            return true;
                        }
                    } else {
                        printf("[%s] inf mismatch: %s=%f %s=%f ", ggml_op_desc(t1), bn1, f1[i], bn2, f2[i]);
                        ud->ok = false;
                        return true;
                    }
                }
            }

            double err = nmse(f1.data(), f2.data(), f1.size());
            if (err > ud->max_err) {
                printf("[%s] NMSE = %.9f > %.9f ", ggml_op_desc(t1), err, ud->max_err);
                //for (int i = 0; i < (int) f1.size(); i++) {
                //    printf("%5d %9.6f %9.6f, diff = %9.6f\n", i, f1[i], f2[i], f1[i] - f2[i]);
                //}
                //printf("\n");
                //exit(1);
                ud->ok = false;
            }
            return true;

            GGML_UNUSED(index);
        };

        const bool cmp_ok = ggml_backend_compare_graph_backend(backend1, backend2, gf, callback, &ud);

        if (!cmp_ok) {
            printf("compare failed ");
        }

        ggml_backend_buffer_free(buf);

        ggml_free(ctx);

        if (ud.ok && cmp_ok) {
            printf("\033[1;32mOK\033[0m\n");
            return true;
        }

        printf("\033[1;31mFAIL\033[0m\n");
        return false;
    }